

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O2

Expression * wasm::toABI(Expression *value,Module *module)

{
  BasicType BVar1;
  Expression *right;
  Block *pBVar2;
  UnaryOp op;
  Builder local_20;
  Builder builder;
  
  local_20.wasm = module;
  BVar1 = Type::getBasic(&value->type);
  switch(BVar1) {
  case none:
    right = LiteralUtils::makeZero((Type)0x3,module);
    pBVar2 = Builder::makeSequence(&local_20,value,right);
    return (Expression *)pBVar2;
  default:
    goto switchD_0083fa09_caseD_1;
  case i32:
    op = ExtendUInt32;
    break;
  case f32:
    value = (Expression *)Builder::makeUnary(&local_20,ReinterpretFloat32,value);
    op = ExtendUInt32;
    break;
  case f64:
    op = ReinterpretFloat64;
    break;
  case v128:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x3f);
  }
  value = (Expression *)Builder::makeUnary(&local_20,op,value);
switchD_0083fa09_caseD_1:
  return (Expression *)(Unary *)value;
}

Assistant:

static Expression* toABI(Expression* value, Module* module) {
  Builder builder(*module);
  switch (value->type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(ExtendUInt32, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ExtendUInt32,
                                builder.makeUnary(ReinterpretFloat32, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretFloat64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      // the value is none, but we need a value here
      value =
        builder.makeSequence(value, LiteralUtils::makeZero(Type::i64, *module));
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}